

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCore.c
# Opt level: O0

Aig_Man_t * Csw_Sweep(Aig_Man_t *pAig,int nCutsMax,int nLeafMax,int fVerbose)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  abctime aVar3;
  Csw_Man_t *p_00;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  ulong uVar6;
  Csw_Cut_t *pCVar7;
  abctime aVar8;
  bool bVar9;
  abctime clk;
  int i;
  Aig_Obj_t *pObjRes;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pRes;
  Csw_Man_t *p;
  int fVerbose_local;
  int nLeafMax_local;
  int nCutsMax_local;
  Aig_Man_t *pAig_local;
  
  aVar3 = Abc_Clock();
  p_00 = Csw_ManStart(pAig,nCutsMax,nLeafMax,fVerbose);
  for (clk._4_4_ = 0; iVar2 = Vec_PtrSize(p_00->pManRes->vCis), clk._4_4_ < iVar2;
      clk._4_4_ = clk._4_4_ + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00->pManRes->vCis,clk._4_4_);
    Csw_ObjPrepareCuts(p_00,pAVar4,1);
    pAVar5 = Aig_ManCi(p_00->pManAig,clk._4_4_);
    Csw_ObjAddRefs(p_00,pAVar4,(uint)(*(ulong *)&pAVar5->field_0x18 >> 6) & 0x3ffffff);
  }
  for (clk._4_4_ = 0; iVar2 = Vec_PtrSize(pAig->vObjs), clk._4_4_ < iVar2; clk._4_4_ = clk._4_4_ + 1
      ) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,clk._4_4_);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar4), iVar2 != 0)) {
      pAVar1 = p_00->pManRes;
      pAVar5 = Csw_ObjChild0Equiv(p_00,pAVar4);
      p1 = Csw_ObjChild1Equiv(p_00,pAVar4);
      pObjRes = Aig_And(pAVar1,pAVar5,p1);
      do {
        pAVar5 = Aig_Regular(pObjRes);
        uVar6 = *(ulong *)&pAVar4->field_0x18 >> 6;
        pAVar5 = Csw_ObjSweep(p_00,pAVar5,
                              (uint)(((uint)uVar6 & 0x3ffffff) != 1 && (uVar6 & 0x3ffffff) != 0));
        iVar2 = Aig_IsComplement(pObjRes);
        pObjRes = Aig_NotCond(pAVar5,iVar2);
        pAVar5 = Aig_Regular(pObjRes);
        pCVar7 = Csw_ObjCuts(p_00,pAVar5);
        bVar9 = false;
        if (pCVar7 == (Csw_Cut_t *)0x0) {
          pAVar5 = Aig_Regular(pObjRes);
          iVar2 = Aig_ObjIsConst1(pAVar5);
          bVar9 = iVar2 == 0;
        }
      } while (bVar9);
      Csw_ObjSetEquiv(p_00,pAVar4,pObjRes);
      pAVar5 = Aig_Regular(pObjRes);
      Csw_ObjAddRefs(p_00,pAVar5,(uint)(*(ulong *)&pAVar4->field_0x18 >> 6) & 0x3ffffff);
    }
  }
  for (clk._4_4_ = 0; iVar2 = Vec_PtrSize(pAig->vCos), clk._4_4_ < iVar2; clk._4_4_ = clk._4_4_ + 1)
  {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,clk._4_4_);
    pAVar1 = p_00->pManRes;
    pAVar4 = Csw_ObjChild0Equiv(p_00,pAVar4);
    Aig_ObjCreateCo(pAVar1,pAVar4);
  }
  Aig_ManCleanup(p_00->pManRes);
  aVar8 = Abc_Clock();
  p_00->timeTotal = aVar8 - aVar3;
  p_00->timeOther = (p_00->timeTotal - p_00->timeCuts) - p_00->timeHash;
  pAVar1 = p_00->pManRes;
  Csw_ManStop(p_00);
  return pAVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Csw_Sweep( Aig_Man_t * pAig, int nCutsMax, int nLeafMax, int fVerbose )
{
    Csw_Man_t * p;
    Aig_Man_t * pRes;
    Aig_Obj_t * pObj, * pObjNew, * pObjRes;
    int i;
    abctime clk;
clk = Abc_Clock();
    // start the manager
    p = Csw_ManStart( pAig, nCutsMax, nLeafMax, fVerbose );
    // set elementary cuts at the PIs
    Aig_ManForEachCi( p->pManRes, pObj, i )
    {
        Csw_ObjPrepareCuts( p, pObj, 1 );
        Csw_ObjAddRefs( p, pObj, Aig_ManCi(p->pManAig,i)->nRefs );
    }
    // process the nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        // create the new node
        pObjNew = Aig_And( p->pManRes, Csw_ObjChild0Equiv(p, pObj), Csw_ObjChild1Equiv(p, pObj) );
        // check if this node can be represented using another node
//        pObjRes = Csw_ObjSweep( p, Aig_Regular(pObjNew), pObj->nRefs > 1 );
//        pObjRes = Aig_NotCond( pObjRes, Aig_IsComplement(pObjNew) );
        // try recursively if resubsitution is used
        do {
            pObjRes = Csw_ObjSweep( p, Aig_Regular(pObjNew), pObj->nRefs > 1 );
            pObjRes = Aig_NotCond( pObjRes, Aig_IsComplement(pObjNew) );        
            pObjNew = pObjRes;
        } while ( Csw_ObjCuts(p, Aig_Regular(pObjNew)) == NULL && !Aig_ObjIsConst1(Aig_Regular(pObjNew)) );
        // save the resulting node
        Csw_ObjSetEquiv( p, pObj, pObjRes );
        // add to the reference counter
        Csw_ObjAddRefs( p, Aig_Regular(pObjRes), pObj->nRefs );
    }
    // add the POs
    Aig_ManForEachCo( pAig, pObj, i )
        Aig_ObjCreateCo( p->pManRes, Csw_ObjChild0Equiv(p, pObj) );
    // remove dangling nodes 
    Aig_ManCleanup( p->pManRes );
    // return the resulting manager
p->timeTotal = Abc_Clock() - clk;
p->timeOther = p->timeTotal - p->timeCuts - p->timeHash;
    pRes = p->pManRes;
    Csw_ManStop( p );
    return pRes;
}